

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyserTests.cpp
# Opt level: O2

void __thiscall
SemanticAnalyserTest_LambdaResultCallWorks_Test::TestBody
          (SemanticAnalyserTest_LambdaResultCallWorks_Test *this)

{
  string source;
  allocator<char> local_29;
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "  \n  fn main(): f32\n  {\n    (\\(x: f32): function = { ret \\(m: f32): f32 = { ret 2; }; })(1)(2);\n    ret 0;\n  }\n  "
             ,&local_29);
  nothrowTest(&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

TEST(SemanticAnalyserTest, LambdaResultCallWorks)
{
  std::string source = R"SRC(  
  fn main(): f32
  {
    (\(x: f32): function = { ret \(m: f32): f32 = { ret 2; }; })(1)(2);
    ret 0;
  }
  )SRC";
  nothrowTest(source);
}